

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_buffer_info(nk_memory_status *s,nk_buffer *b)

{
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1a56,"void nk_buffer_info(struct nk_memory_status *, struct nk_buffer *)");
  }
  if (s != (nk_memory_status *)0x0) {
    s->allocated = b->allocated;
    s->size = (b->memory).size;
    s->needed = b->needed;
    s->memory = (b->memory).ptr;
    s->calls = b->calls;
    return;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1a57,"void nk_buffer_info(struct nk_memory_status *, struct nk_buffer *)");
}

Assistant:

NK_API void
nk_buffer_info(struct nk_memory_status *s, struct nk_buffer *b)
{
    NK_ASSERT(b);
    NK_ASSERT(s);
    if (!s || !b) return;
    s->allocated = b->allocated;
    s->size =  b->memory.size;
    s->needed = b->needed;
    s->memory = b->memory.ptr;
    s->calls = b->calls;
}